

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_46569::DepsLogTestTruncated::Run(DepsLogTestTruncated *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  LoadStatus LVar4;
  Node *pNVar5;
  ulong uVar6;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar7;
  size_type sVar8;
  vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_> *pvVar9;
  reference ppDVar10;
  __normal_iterator<DepsLog::Deps_*const_*,_std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>_>
  local_4f0;
  __normal_iterator<DepsLog::Deps_*const_*,_std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>_>
  local_4e8;
  const_iterator i;
  int new_deps_count;
  undefined1 local_4b8 [8];
  DepsLog log_1;
  State state_1;
  string local_348;
  undefined1 local_328 [8];
  string err_1;
  int local_300;
  int size;
  int deps_count;
  int node_count;
  stat st;
  StringPiece local_258;
  Node *local_248;
  StringPiece local_240;
  Node *local_230;
  StringPiece local_228;
  StringPiece local_218;
  Node *local_208;
  StringPiece local_200;
  Node *local_1f0;
  undefined1 local_1e8 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_1c8;
  undefined1 local_1a8 [8];
  string err;
  undefined1 local_178 [8];
  DepsLog log;
  State state;
  DepsLogTestTruncated *this_local;
  
  State::State((State *)&log.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  DepsLog::DepsLog((DepsLog *)local_178);
  std::__cxx11::string::string((string *)local_1a8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"DepsLogTest-tempfile",
             (allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = DepsLog::OpenForWrite((DepsLog *)local_178,&local_1c8,(string *)local_1a8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
             ,0x168,"log.OpenForWrite(kTestFilename, &err)");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x169,"\"\" == err");
  if (bVar2) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_200,"foo.h");
    local_1f0 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_200,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_1f0);
    StringPiece::StringPiece(&local_218,"bar.h");
    local_208 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_218,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_208);
    StringPiece::StringPiece(&local_228,"out.o");
    pNVar5 = State::GetNode((State *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_228,0
                           );
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar5,1,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    std::vector<Node_*,_std::allocator<Node_*>_>::clear
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    StringPiece::StringPiece(&local_240,"foo.h");
    local_230 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_240,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_230);
    StringPiece::StringPiece(&local_258,"bar2.h");
    local_248 = State::GetNode((State *)&log.deps_.
                                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               local_258,0);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8,&local_248);
    StringPiece::StringPiece((StringPiece *)(st.__glibc_reserved + 2),"out2.o");
    pNVar5 = State::GetNode((State *)&log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            stack0xfffffffffffffd98,0);
    DepsLog::RecordDeps((DepsLog *)local_178,pNVar5,2,
                        (vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
    DepsLog::Close((DepsLog *)local_178);
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_1e8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_3_ = 0;
  deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = !bVar2;
  std::__cxx11::string::~string((string *)local_1a8);
  DepsLog::~DepsLog((DepsLog *)local_178);
  State::~State((State *)&log.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar1 = g_current_test;
  if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage == 0) {
    iVar3 = stat("DepsLogTest-tempfile",(stat *)&deps_count);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar3 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x17a,"0 == stat(kTestFilename, &st)");
    if (bVar2) {
      size = 5;
      local_300 = 2;
      for (err_1.field_2._12_4_ = (undefined4)st.st_rdev; 0 < (int)err_1.field_2._12_4_;
          err_1.field_2._12_4_ = err_1.field_2._12_4_ + -1) {
        std::__cxx11::string::string((string *)local_328);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"DepsLogTest-tempfile",
                   (allocator<char> *)
                   ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        bVar2 = Truncate(&local_348,(long)(int)err_1.field_2._12_4_,(string *)local_328);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x183,"Truncate(kTestFilename, size, &err)");
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          State::State((State *)&log_1.deps_.
                                 super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          DepsLog::DepsLog((DepsLog *)local_4b8);
          pTVar1 = g_current_test;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&new_deps_count,"DepsLogTest-tempfile",
                     (allocator<char> *)((long)&i._M_current + 7));
          LVar4 = DepsLog::Load((DepsLog *)local_4b8,(string *)&new_deps_count,
                                (State *)&log_1.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (string *)local_328);
          testing::Test::Check
                    (pTVar1,LVar4 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x187,"log.Load(kTestFilename, &state, &err)");
          std::__cxx11::string::~string((string *)&new_deps_count);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
          uVar6 = std::__cxx11::string::empty();
          pTVar1 = g_current_test;
          if ((uVar6 & 1) == 0) {
            deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage._0_4_ = 2;
          }
          else {
            pvVar7 = DepsLog::nodes((DepsLog *)local_4b8);
            sVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::size(pvVar7);
            bVar2 = testing::Test::Check
                              (pTVar1,(int)sVar8 <= size,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0x18d,"node_count >= (int)log.nodes().size()");
            if (bVar2) {
              pvVar7 = DepsLog::nodes((DepsLog *)local_4b8);
              sVar8 = std::vector<Node_*,_std::allocator<Node_*>_>::size(pvVar7);
              size = (int)sVar8;
              i._M_current._0_4_ = 0;
              pvVar9 = DepsLog::deps((DepsLog *)local_4b8);
              local_4e8._M_current =
                   (Deps **)std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::begin
                                      (pvVar9);
              while( true ) {
                pvVar9 = DepsLog::deps((DepsLog *)local_4b8);
                local_4f0._M_current =
                     (Deps **)std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::end
                                        (pvVar9);
                bVar2 = __gnu_cxx::operator!=(&local_4e8,&local_4f0);
                if (!bVar2) break;
                ppDVar10 = __gnu_cxx::
                           __normal_iterator<DepsLog::Deps_*const_*,_std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>_>
                           ::operator*(&local_4e8);
                if (*ppDVar10 != (Deps *)0x0) {
                  i._M_current._0_4_ = (int)i._M_current + 1;
                }
                __gnu_cxx::
                __normal_iterator<DepsLog::Deps_*const_*,_std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>_>
                ::operator++(&local_4e8);
              }
              bVar2 = testing::Test::Check
                                (g_current_test,(int)i._M_current <= local_300,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0x197,"deps_count >= new_deps_count");
              if (bVar2) {
                local_300 = (int)i._M_current;
                deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          DepsLog::~DepsLog((DepsLog *)local_4b8);
          State::~State((State *)&log_1.deps_.
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_328);
        if ((uint)deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != 0) {
          return;
        }
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, Truncated) {
  // Create a file with some entries.
  {
    State state;
    DepsLog log;
    string err;
    EXPECT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar2.h", 0));
    log.RecordDeps(state.GetNode("out2.o", 0), 2, deps);

    log.Close();
  }

  // Get the file size.
  struct stat st;
  ASSERT_EQ(0, stat(kTestFilename, &st));

  // Try reloading at truncated sizes.
  // Track how many nodes/deps were found; they should decrease with
  // smaller sizes.
  int node_count = 5;
  int deps_count = 2;
  for (int size = (int)st.st_size; size > 0; --size) {
    string err;
    ASSERT_TRUE(Truncate(kTestFilename, size, &err));

    State state;
    DepsLog log;
    EXPECT_TRUE(log.Load(kTestFilename, &state, &err));
    if (!err.empty()) {
      // At some point the log will be so short as to be unparseable.
      break;
    }

    ASSERT_GE(node_count, (int)log.nodes().size());
    node_count = log.nodes().size();

    // Count how many non-NULL deps entries there are.
    int new_deps_count = 0;
    for (vector<DepsLog::Deps*>::const_iterator i = log.deps().begin();
         i != log.deps().end(); ++i) {
      if (*i)
        ++new_deps_count;
    }
    ASSERT_GE(deps_count, new_deps_count);
    deps_count = new_deps_count;
  }
}